

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

int glslang::TIntermediate::computeTypeUniformLocationSize(TType *type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TTypeList *pTVar4;
  int size;
  int member;
  TType elementType;
  
  iVar1 = (*type->_vptr_TType[0x1d])();
  if ((char)iVar1 == '\0') {
    iVar1 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
      iVar2 = 0;
      while( true ) {
        pTVar4 = TType::getStruct(type);
        if ((int)((ulong)((long)(pTVar4->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar4->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ).
                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5) <= iVar2) break;
        TType::TType(&elementType,type,iVar2,false);
        iVar3 = computeTypeUniformLocationSize(&elementType);
        iVar1 = iVar1 + iVar3;
        iVar2 = iVar2 + 1;
      }
    }
  }
  else {
    TType::TType(&elementType,type,0,false);
    iVar1 = (*type->_vptr_TType[0x1e])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = computeTypeUniformLocationSize(&elementType);
    }
    else {
      iVar2 = (*type->_vptr_TType[0xf])(type);
      iVar1 = computeTypeUniformLocationSize(&elementType);
      iVar1 = iVar1 * iVar2;
    }
  }
  return iVar1;
}

Assistant:

int TIntermediate::computeTypeUniformLocationSize(const TType& type)
{
    // "Individual elements of a uniform array are assigned
    // consecutive locations with the first element taking location
    // location."
    if (type.isArray()) {
        // TODO: perf: this can be flattened by using getCumulativeArraySize(), and a deref that discards all arrayness
        TType elementType(type, 0);
        if (type.isSizedArray()) {
            return type.getOuterArraySize() * computeTypeUniformLocationSize(elementType);
        } else {
            // TODO: are there valid cases of having an implicitly-sized array with a location?  If so, running this code too early.
            return computeTypeUniformLocationSize(elementType);
        }
    }

    // "Each subsequent inner-most member or element gets incremental
    // locations for the entire structure or array."
    if (type.isStruct()) {
        int size = 0;
        for (int member = 0; member < (int)type.getStruct()->size(); ++member) {
            TType memberType(type, member);
            size += computeTypeUniformLocationSize(memberType);
        }
        return size;
    }

    return 1;
}